

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

xmlSchemaBasicItemPtr
xmlSchemaFindRedefCompInGraph
          (xmlSchemaBucketPtr_conflict bucket,xmlSchemaTypeType type,xmlChar *name,xmlChar *nsName)

{
  uint uVar1;
  xmlSchemaItemListPtr pxVar2;
  xmlChar *pxVar3;
  xmlSchemaBucketPtr_conflict bucket_00;
  xmlSchemaBasicItemPtr pxVar4;
  ulong uVar5;
  ulong uVar6;
  xmlSchemaSchemaRelationPtr_conflict rel;
  xmlSchemaSchemaRelationPtr_conflict pxVar7;
  
  if (name != (xmlChar *)0x0 && bucket != (xmlSchemaBucketPtr_conflict)0x0) {
    pxVar2 = bucket->globals;
    if ((pxVar2 != (xmlSchemaItemListPtr)0x0) && (uVar1 = pxVar2->nbItems, uVar1 != 0)) {
      uVar5 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar5 = 0;
      }
      for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        pxVar4 = (xmlSchemaBasicItemPtr)pxVar2->items[uVar6];
        if (pxVar4->type == type) {
          if (type - XML_SCHEMA_TYPE_SIMPLE < 2) {
            if (*(xmlChar **)(pxVar4 + 1) == name) {
              pxVar3 = *(xmlChar **)(pxVar4 + 0xd);
              goto joined_r0x00197285;
            }
          }
          else if (type == XML_SCHEMA_TYPE_ATTRIBUTEGROUP) {
            if (*(xmlChar **)(pxVar4 + 1) == name) {
              pxVar3 = (xmlChar *)pxVar4[6].dummy;
              goto joined_r0x00197285;
            }
          }
          else {
            if (type != XML_SCHEMA_TYPE_GROUP) {
              return (xmlSchemaBasicItemPtr)0x0;
            }
            if (*(xmlChar **)(pxVar4 + 2) == name) {
              pxVar3 = (xmlChar *)pxVar4[2].dummy;
joined_r0x00197285:
              if (pxVar3 == nsName) {
                return pxVar4;
              }
            }
          }
        }
      }
    }
    pxVar7 = bucket->relations;
    if (pxVar7 != (xmlSchemaSchemaRelationPtr_conflict)0x0) {
      *(byte *)&bucket->flags = (byte)bucket->flags | 1;
      do {
        bucket_00 = pxVar7->bucket;
        if (((bucket_00 != (xmlSchemaBucketPtr_conflict)0x0) && ((bucket_00->flags & 1) == 0)) &&
           (pxVar4 = xmlSchemaFindRedefCompInGraph(bucket_00,type,name,nsName),
           pxVar4 != (xmlSchemaBasicItemPtr)0x0)) {
          return pxVar4;
        }
        pxVar7 = pxVar7->next;
      } while (pxVar7 != (xmlSchemaSchemaRelationPtr)0x0);
      *(byte *)&bucket->flags = (byte)bucket->flags ^ 1;
    }
  }
  return (xmlSchemaBasicItemPtr)0x0;
}

Assistant:

static xmlSchemaBasicItemPtr
xmlSchemaFindRedefCompInGraph(xmlSchemaBucketPtr bucket,
			      xmlSchemaTypeType type,
			      const xmlChar *name,
			      const xmlChar *nsName)
{
    xmlSchemaBasicItemPtr ret;
    int i;

    if ((bucket == NULL) || (name == NULL))
	return(NULL);
    if ((bucket->globals == NULL) ||
	(bucket->globals->nbItems == 0))
	goto subschemas;
    /*
    * Search in global components.
    */
    for (i = 0; i < bucket->globals->nbItems; i++) {
	ret = bucket->globals->items[i];
	if (ret->type == type) {
	    switch (type) {
		case XML_SCHEMA_TYPE_COMPLEX:
		case XML_SCHEMA_TYPE_SIMPLE:
		    if ((WXS_COMP_NAME(ret, xmlSchemaTypePtr) == name) &&
			(WXS_COMP_TNS(ret, xmlSchemaTypePtr) ==
			nsName))
		    {
			return(ret);
		    }
		    break;
		case XML_SCHEMA_TYPE_GROUP:
		    if ((WXS_COMP_NAME(ret,
			    xmlSchemaModelGroupDefPtr) == name) &&
			(WXS_COMP_TNS(ret,
			    xmlSchemaModelGroupDefPtr) == nsName))
		    {
			return(ret);
		    }
		    break;
		case XML_SCHEMA_TYPE_ATTRIBUTEGROUP:
		    if ((WXS_COMP_NAME(ret,
			    xmlSchemaAttributeGroupPtr) == name) &&
			(WXS_COMP_TNS(ret,
			    xmlSchemaAttributeGroupPtr) == nsName))
		    {
			return(ret);
		    }
		    break;
		default:
		    /* Should not be hit. */
		    return(NULL);
	    }
	}
    }
subschemas:
    /*
    * Process imported/included schemas.
    */
    if (bucket->relations != NULL) {
	xmlSchemaSchemaRelationPtr rel = bucket->relations;

	/*
	* TODO: Marking the bucket will not avoid multiple searches
	* in the same schema, but avoids at least circularity.
	*/
	bucket->flags |= XML_SCHEMA_BUCKET_MARKED;
	do {
	    if ((rel->bucket != NULL) &&
		((rel->bucket->flags & XML_SCHEMA_BUCKET_MARKED) == 0)) {
		ret = xmlSchemaFindRedefCompInGraph(rel->bucket,
		    type, name, nsName);
		if (ret != NULL)
		    return(ret);
	    }
	    rel = rel->next;
	} while (rel != NULL);
	 bucket->flags ^= XML_SCHEMA_BUCKET_MARKED;
    }
    return(NULL);
}